

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int findIndexCol(Parse *pParse,ExprList *pList,int iBase,Index *pIdx,int iCol)

{
  char *zRight;
  Expr *pExpr;
  int iVar1;
  Expr *pEVar2;
  CollSeq *pCVar3;
  long lVar4;
  long lVar5;
  
  zRight = pIdx->azColl[iCol];
  lVar5 = 0;
  lVar4 = 0;
  while( true ) {
    if (pList->nExpr <= lVar4) {
      return -1;
    }
    pExpr = *(Expr **)((long)&pList->a->pExpr + lVar5);
    pEVar2 = sqlite3ExprSkipCollate(pExpr);
    if ((((pEVar2->op == 0x98) && (pIdx->aiColumn[iCol] == (int)pEVar2->iColumn)) &&
        (pEVar2->iTable == iBase)) &&
       ((pCVar3 = sqlite3ExprCollSeq(pParse,pExpr), pCVar3 != (CollSeq *)0x0 &&
        (iVar1 = sqlite3_stricmp(pCVar3->zName,zRight), iVar1 == 0)))) break;
    lVar4 = lVar4 + 1;
    lVar5 = lVar5 + 0x20;
  }
  return (int)lVar4;
}

Assistant:

static int findIndexCol(
  Parse *pParse,                  /* Parse context */
  ExprList *pList,                /* Expression list to search */
  int iBase,                      /* Cursor for table associated with pIdx */
  Index *pIdx,                    /* Index to match column of */
  int iCol                        /* Column of index to match */
){
  int i;
  const char *zColl = pIdx->azColl[iCol];

  for(i=0; i<pList->nExpr; i++){
    Expr *p = sqlite3ExprSkipCollate(pList->a[i].pExpr);
    if( p->op==TK_COLUMN
     && p->iColumn==pIdx->aiColumn[iCol]
     && p->iTable==iBase
    ){
      CollSeq *pColl = sqlite3ExprCollSeq(pParse, pList->a[i].pExpr);
      if( ALWAYS(pColl) && 0==sqlite3StrICmp(pColl->zName, zColl) ){
        return i;
      }
    }
  }

  return -1;
}